

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O1

void __thiscall CTxMemPoolEntry::UpdateModifiedFee(CTxMemPoolEntry *this,CAmount fee_diff)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = this->nModFeesWithDescendants;
  lVar3 = 0x7fffffffffffffff;
  if (lVar2 < 1 || fee_diff <= 0x7fffffffffffffff - lVar2) {
    lVar3 = -0x8000000000000000;
    if (-0x8000000000000000 - lVar2 <= fee_diff) {
      lVar3 = lVar2 + fee_diff;
    }
    if (-1 < lVar2) {
      lVar3 = lVar2 + fee_diff;
    }
  }
  this->nModFeesWithDescendants = lVar3;
  lVar2 = this->nModFeesWithAncestors;
  lVar3 = 0x7fffffffffffffff;
  if (lVar2 < 1 || fee_diff <= 0x7fffffffffffffff - lVar2) {
    lVar3 = -0x8000000000000000;
    if (-0x8000000000000000 - lVar2 <= fee_diff) {
      lVar3 = lVar2 + fee_diff;
    }
    if (-1 < lVar2) {
      lVar3 = lVar2 + fee_diff;
    }
  }
  this->nModFeesWithAncestors = lVar3;
  lVar2 = this->m_modified_fee;
  lVar3 = 0x7fffffffffffffff;
  if (lVar2 < 1 || fee_diff <= 0x7fffffffffffffff - lVar2) {
    lVar3 = -0x8000000000000000;
    if (-0x8000000000000000 - lVar2 <= fee_diff) {
      lVar3 = lVar2 + fee_diff;
    }
    if (-1 < lVar2) {
      lVar3 = lVar2 + fee_diff;
    }
  }
  this->m_modified_fee = lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UpdateModifiedFee(CAmount fee_diff)
    {
        nModFeesWithDescendants = SaturatingAdd(nModFeesWithDescendants, fee_diff);
        nModFeesWithAncestors = SaturatingAdd(nModFeesWithAncestors, fee_diff);
        m_modified_fee = SaturatingAdd(m_modified_fee, fee_diff);
    }